

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_priority_queue.c
# Opt level: O0

void percolate_down(roaring_pq_t *pq,uint32_t i)

{
  _Bool _Var1;
  uint64_t *puVar2;
  uint in_ESI;
  long *in_RDI;
  roaring_pq_element_t bestc;
  uint32_t r;
  uint32_t l;
  roaring_pq_element_t ai;
  uint32_t hsize;
  uint32_t size;
  roaring_pq_element_t local_50;
  uint local_38;
  uint local_34;
  roaring_pq_element_t local_30;
  uint local_14;
  uint local_10;
  uint local_c;
  long *local_8;
  
  local_10 = (uint)in_RDI[1];
  local_14 = local_10 >> 1;
  puVar2 = (uint64_t *)(*in_RDI + (ulong)in_ESI * 0x18);
  local_30.size = *puVar2;
  local_30._8_8_ = puVar2[1];
  local_30.bitmap = (roaring_bitmap_t *)puVar2[2];
  local_c = in_ESI;
  local_8 = in_RDI;
  while (local_c < local_14) {
    local_34 = local_c * 2 + 1;
    local_38 = local_c * 2 + 2;
    puVar2 = (uint64_t *)(*local_8 + (ulong)local_34 * 0x18);
    local_50.size = *puVar2;
    local_50._8_8_ = puVar2[1];
    local_50.bitmap = (roaring_bitmap_t *)puVar2[2];
    if ((local_38 < local_10) &&
       (_Var1 = compare((roaring_pq_element_t *)(*local_8 + (ulong)local_38 * 0x18),&local_50),
       _Var1)) {
      local_34 = local_38;
      puVar2 = (uint64_t *)(*local_8 + (ulong)local_38 * 0x18);
      local_50.size = *puVar2;
      local_50._8_8_ = puVar2[1];
      local_50.bitmap = (roaring_bitmap_t *)puVar2[2];
    }
    _Var1 = compare(&local_50,&local_30);
    if (!_Var1) break;
    puVar2 = (uint64_t *)(*local_8 + (ulong)local_c * 0x18);
    *puVar2 = local_50.size;
    puVar2[1] = local_50._8_8_;
    puVar2[2] = (uint64_t)local_50.bitmap;
    local_c = local_34;
  }
  puVar2 = (uint64_t *)(*local_8 + (ulong)local_c * 0x18);
  *puVar2 = local_30.size;
  puVar2[1] = local_30._8_8_;
  puVar2[2] = (uint64_t)local_30.bitmap;
  return;
}

Assistant:

static void percolate_down(roaring_pq_t *pq, uint32_t i) {
    uint32_t size = (uint32_t)pq->size;
    uint32_t hsize = size >> 1;
    roaring_pq_element_t ai = pq->elements[i];
    while (i < hsize) {
        uint32_t l = (i << 1) + 1;
        uint32_t r = l + 1;
        roaring_pq_element_t bestc = pq->elements[l];
        if (r < size) {
            if (compare(pq->elements + r, &bestc)) {
                l = r;
                bestc = pq->elements[r];
            }
        }
        if (!compare(&bestc, &ai)) {
            break;
        }
        pq->elements[i] = bestc;
        i = l;
    }
    pq->elements[i] = ai;
}